

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.cpp
# Opt level: O0

SHA3_256 * __thiscall SHA3_256::Finalize(SHA3_256 *this,Span<unsigned_char> output)

{
  long lVar1;
  size_t sVar2;
  uint64_t uVar3;
  SHA3_256 *in_RDI;
  long in_FS_OFFSET;
  uint i;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar4;
  SHA3_256 *__first;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first = in_RDI;
  sVar2 = Span<unsigned_char>::size((Span<unsigned_char> *)in_RDI);
  if (sVar2 != 0x20) {
    __assert_fail("output.size() == OUTPUT_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/sha3.cpp"
                  ,0x8a,"SHA3_256 &SHA3_256::Finalize(Span<unsigned char>)");
  }
  std::fill<unsigned_char*,int>
            ((uchar *)__first,(uchar *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
             ,(int *)in_RDI);
  in_RDI->m_buffer[in_RDI->m_bufsize] = in_RDI->m_buffer[in_RDI->m_bufsize] ^ 6;
  uVar3 = ::ReadLE64((uchar *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  in_RDI->m_state[in_RDI->m_pos] = uVar3 ^ in_RDI->m_state[in_RDI->m_pos];
  in_RDI->m_state[0x10] = in_RDI->m_state[0x10] ^ 0x8000000000000000;
  KeccakF((uint64_t (*) [25])output.m_size);
  for (uVar4 = 0; uVar4 < 4; uVar4 = uVar4 + 1) {
    Span<unsigned_char>::data((Span<unsigned_char> *)in_RDI);
    WriteLE64((uchar *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),(uint64_t)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

SHA3_256& SHA3_256::Finalize(Span<unsigned char> output)
{
    assert(output.size() == OUTPUT_SIZE);
    std::fill(m_buffer + m_bufsize, m_buffer + sizeof(m_buffer), 0);
    m_buffer[m_bufsize] ^= 0x06;
    m_state[m_pos] ^= ReadLE64(m_buffer);
    m_state[RATE_BUFFERS - 1] ^= 0x8000000000000000;
    KeccakF(m_state);
    for (unsigned i = 0; i < 4; ++i) {
        WriteLE64(output.data() + 8 * i, m_state[i]);
    }
    return *this;
}